

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::AnnotatedEnumHandler
          (AnnotatedEnumHandler *this,EnumSchema schema)

{
  size_t *__return_storage_ptr__;
  StringPtr key;
  bool bVar1;
  uint uVar2;
  uint64_t uVar3;
  Iterator IVar4;
  Reader RVar5;
  Iterator IVar6;
  ArrayPtr<const_char> AVar7;
  Array<kj::StringPtr> local_270;
  char *local_258;
  char *pcStack_250;
  Reader local_240;
  ArrayPtr<const_char> local_210;
  undefined1 local_200 [8];
  Reader anno;
  undefined1 local_1c0 [8];
  Iterator __end3;
  undefined1 local_1a0 [8];
  Iterator __begin3;
  Reader *__range3;
  undefined1 auStack_148 [8];
  StringPtr name;
  Reader proto;
  Enumerant e;
  undefined1 local_b8 [8];
  Iterator __end2;
  undefined1 local_98 [8];
  Iterator __begin2;
  EnumerantList *__range2;
  ArrayBuilder<kj::StringPtr> builder;
  EnumerantList enumerants;
  AnnotatedEnumHandler *this_local;
  EnumSchema schema_local;
  
  this_local = (AnnotatedEnumHandler *)schema.super_Schema.raw;
  Handler<capnp::DynamicEnum,_(capnp::Style)0>::Handler
            (&this->super_Handler<capnp::DynamicEnum,_(capnp::Style)0>);
  (this->super_Handler<capnp::DynamicEnum,_(capnp::Style)0>).super_HandlerBase._vptr_HandlerBase =
       (_func_int **)&PTR_encodeBase_00d882f8;
  (this->schema).super_Schema.raw = (RawBrandedSchema *)this_local;
  kj::Array<kj::StringPtr>::Array(&this->valueToName);
  kj::HashMap<kj::StringPtr,_unsigned_short>::HashMap(&this->nameToValue);
  EnumSchema::getEnumerants((EnumerantList *)&builder.disposer,(EnumSchema *)&this_local);
  uVar2 = EnumSchema::EnumerantList::size((EnumerantList *)&builder.disposer);
  kj::heapArrayBuilder<kj::StringPtr>((ArrayBuilder<kj::StringPtr> *)&__range2,(ulong)uVar2);
  __begin2._8_8_ = &builder.disposer;
  IVar4 = EnumSchema::EnumerantList::begin((EnumerantList *)__begin2._8_8_);
  __end2._8_8_ = IVar4.container;
  __begin2.container._0_4_ = IVar4.index;
  local_98 = (undefined1  [8])__end2._8_8_;
  IVar4 = EnumSchema::EnumerantList::end((EnumerantList *)__begin2._8_8_);
  local_b8 = (undefined1  [8])IVar4.container;
  __end2.container._0_4_ = IVar4.index;
  while( true ) {
    bVar1 = capnp::_::
            IndexingIterator<const_capnp::EnumSchema::EnumerantList,_capnp::EnumSchema::Enumerant>::
            operator==((IndexingIterator<const_capnp::EnumSchema::EnumerantList,_capnp::EnumSchema::Enumerant>
                        *)local_98,
                       (IndexingIterator<const_capnp::EnumSchema::EnumerantList,_capnp::EnumSchema::Enumerant>
                        *)local_b8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    capnp::_::IndexingIterator<const_capnp::EnumSchema::EnumerantList,_capnp::EnumSchema::Enumerant>
    ::operator*((Enumerant *)&proto._reader.nestingLimit,
                (IndexingIterator<const_capnp::EnumSchema::EnumerantList,_capnp::EnumSchema::Enumerant>
                 *)local_98);
    __return_storage_ptr__ = &name.content.size_;
    EnumSchema::Enumerant::getProto
              ((Reader *)__return_storage_ptr__,(Enumerant *)&proto._reader.nestingLimit);
    RVar5 = capnp::schema::Enumerant::Reader::getName((Reader *)__return_storage_ptr__);
    name.content.ptr = RVar5.super_StringPtr.content.size_;
    auStack_148 = RVar5.super_StringPtr.content.ptr;
    capnp::schema::Enumerant::Reader::getAnnotations
              ((Reader *)&__begin3.index,(Reader *)&name.content.size_);
    IVar6 = List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader::begin
                      ((Reader *)&__begin3.index);
    __end3._8_8_ = IVar6.container;
    __begin3.container._0_4_ = IVar6.index;
    local_1a0 = (undefined1  [8])__end3._8_8_;
    IVar6 = List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader::end((Reader *)&__begin3.index);
    anno._reader._40_8_ = IVar6.container;
    __end3.container._0_4_ = IVar6.index;
    local_1c0 = (undefined1  [8])anno._reader._40_8_;
    while( true ) {
      bVar1 = capnp::_::
              IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
              ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                            *)local_1a0,
                           (IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                            *)local_1c0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
      ::operator*((Reader *)local_200,
                  (IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                   *)local_1a0);
      uVar3 = capnp::schema::Annotation::Reader::getId((Reader *)local_200);
      AVar7.size_ = (size_t)name.content.ptr;
      AVar7.ptr = (char *)auStack_148;
      if (uVar3 == 0xfa5b1fd61c2e7c3d) {
        capnp::schema::Annotation::Reader::getValue(&local_240,(Reader *)local_200);
        AVar7 = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText(&local_240);
        local_210 = AVar7;
      }
      name.content.ptr = (char *)AVar7.size_;
      auStack_148 = (undefined1  [8])AVar7.ptr;
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                    *)local_1a0);
    }
    kj::ArrayBuilder<kj::StringPtr>::add<kj::StringPtr&>
              ((ArrayBuilder<kj::StringPtr> *)&__range2,(StringPtr *)auStack_148);
    local_258 = (char *)auStack_148;
    pcStack_250 = name.content.ptr;
    uVar2 = EnumSchema::Enumerant::getIndex((Enumerant *)&proto._reader.nestingLimit);
    key.content.size_ = (size_t)pcStack_250;
    key.content.ptr = local_258;
    kj::HashMap<kj::StringPtr,_unsigned_short>::insert(&this->nameToValue,key,(unsigned_short)uVar2)
    ;
    capnp::_::IndexingIterator<const_capnp::EnumSchema::EnumerantList,_capnp::EnumSchema::Enumerant>
    ::operator++((IndexingIterator<const_capnp::EnumSchema::EnumerantList,_capnp::EnumSchema::Enumerant>
                  *)local_98);
  }
  kj::ArrayBuilder<kj::StringPtr>::finish(&local_270,(ArrayBuilder<kj::StringPtr> *)&__range2);
  kj::Array<kj::StringPtr>::operator=(&this->valueToName,&local_270);
  kj::Array<kj::StringPtr>::~Array(&local_270);
  kj::ArrayBuilder<kj::StringPtr>::~ArrayBuilder((ArrayBuilder<kj::StringPtr> *)&__range2);
  return;
}

Assistant:

AnnotatedEnumHandler(EnumSchema schema): schema(schema) {
    auto enumerants = schema.getEnumerants();
    auto builder = kj::heapArrayBuilder<kj::StringPtr>(enumerants.size());

    for (auto e: enumerants) {
      auto proto = e.getProto();
      kj::StringPtr name = proto.getName();

      for (auto anno: proto.getAnnotations()) {
        switch (anno.getId()) {
          case JSON_NAME_ANNOTATION_ID:
            name = anno.getValue().getText();
            break;
        }
      }

      builder.add(name);
      nameToValue.insert(name, e.getIndex());
    }

    valueToName = builder.finish();
  }